

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressBlock_doubleFast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  ulong *puVar5;
  BYTE *pBVar6;
  undefined8 *puVar7;
  uint uVar8;
  uint uVar9;
  ZSTD_longLengthType_e ZVar10;
  BYTE *pBVar11;
  U32 *pUVar12;
  U32 *pUVar13;
  BYTE *pBVar14;
  bool bVar15;
  undefined8 uVar16;
  ulong *puVar17;
  ulong *puVar18;
  seqDef *psVar19;
  byte bVar20;
  byte bVar21;
  int *piVar22;
  uint uVar23;
  ulong uVar24;
  ulong *puVar25;
  int iVar26;
  U32 UVar27;
  ulong *puVar28;
  ulong *puVar29;
  uint uVar30;
  uint uVar31;
  ulong uVar32;
  ulong uVar33;
  uint uVar34;
  ulong *puVar35;
  long lVar36;
  uint uVar37;
  uint uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  long lVar42;
  ulong uVar43;
  int iVar44;
  BYTE *litEnd_1;
  BYTE *litEnd;
  ulong *puVar45;
  ulong uVar46;
  ulong *puVar47;
  BYTE *pInLoopLimit_3;
  BYTE *litLimit_w;
  BYTE *iend;
  BYTE *pInLoopLimit;
  BYTE *pInLoopLimit_2;
  BYTE *prefixLowest;
  BYTE *base;
  U32 *hashLong;
  BYTE *ilimit;
  U32 *hashSmall;
  U32 prefixLowestIndex;
  ulong local_e0;
  ulong local_88;
  
  pBVar11 = (ms->window).base;
  puVar5 = (ulong *)((long)src + srcSize);
  iVar44 = (int)pBVar11;
  iVar26 = (int)puVar5 - iVar44;
  uVar34 = (ms->window).dictLimit;
  uVar37 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar23 = iVar26 - uVar37;
  if (iVar26 - uVar34 <= uVar37) {
    uVar23 = uVar34;
  }
  if (ms->loadedDictEnd != 0) {
    uVar23 = uVar34;
  }
  puVar28 = (ulong *)(pBVar11 + uVar23);
  puVar45 = (ulong *)((long)src + (ulong)(puVar28 == (ulong *)src));
  iVar26 = (int)puVar45 - iVar44;
  uVar30 = iVar26 - uVar37;
  if (iVar26 - uVar34 <= uVar37) {
    uVar30 = uVar34;
  }
  if (ms->loadedDictEnd != 0) {
    uVar30 = uVar34;
  }
  uVar34 = rep[1];
  uVar30 = iVar26 - uVar30;
  uVar37 = uVar34;
  if (uVar30 < uVar34) {
    uVar37 = 0;
  }
  uVar46 = (ulong)uVar37;
  puVar17 = (ulong *)((long)src + (srcSize - 8));
  uVar8 = *rep;
  uVar38 = 0;
  if (uVar8 <= uVar30) {
    uVar38 = uVar8;
  }
  puVar29 = (ulong *)((long)src + (ulong)(puVar28 == (ulong *)src) + 1);
  uVar9 = (ms->cParams).minMatch;
  pUVar12 = ms->hashTable;
  pUVar13 = ms->chainTable;
  if (uVar9 == 5) {
    if (puVar29 <= puVar17) {
      uVar37 = (ms->cParams).hashLog;
      if ((uVar37 < 0x21) && (uVar9 = (ms->cParams).chainLog, uVar9 < 0x21)) {
        bVar20 = 0x40 - (char)uVar37;
        bVar21 = 0x40 - (char)uVar9;
        puVar1 = (ulong *)((long)puVar5 - 7);
        puVar2 = (ulong *)((long)puVar5 - 3);
        puVar3 = (ulong *)((long)puVar5 - 1);
        puVar4 = puVar5 + -4;
LAB_0014d7ab:
        uVar37 = (uint)uVar46;
        uVar33 = *puVar45 * -0x30e44323485a9b9d >> (bVar20 & 0x3f);
        puVar25 = puVar45 + 0x20;
        uVar43 = (ulong)pUVar12[uVar33];
        puVar35 = (ulong *)(pBVar11 + uVar43);
        lVar42 = -(ulong)uVar38;
        uVar39 = 1;
        uVar40 = *puVar45;
        while( true ) {
          puVar18 = puVar29;
          uVar24 = uVar40 * -0x30e4432345000000 >> (bVar21 & 0x3f);
          uVar9 = pUVar13[uVar24];
          uVar41 = (ulong)uVar9;
          UVar27 = (int)puVar45 - iVar44;
          pUVar13[uVar24] = UVar27;
          pUVar12[uVar33] = UVar27;
          if ((uVar38 != 0) && (*(int *)((long)puVar45 + lVar42 + 1) == *(int *)((long)puVar45 + 1))
             ) {
            puVar29 = (ulong *)((long)puVar45 + 5);
            puVar35 = (ulong *)((long)puVar45 + lVar42 + 5);
            puVar25 = puVar29;
            if (puVar1 <= puVar29) goto LAB_0014dacb;
            if (*puVar35 != *puVar29) {
              uVar33 = *puVar29 ^ *puVar35;
              uVar40 = 0;
              if (uVar33 != 0) {
                for (; (uVar33 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                }
              }
              uVar40 = uVar40 >> 3 & 0x1fffffff;
              goto LAB_0014db15;
            }
            lVar36 = 0;
            goto LAB_0014d901;
          }
          uVar24 = *puVar18;
          uVar33 = uVar24 * -0x30e44323485a9b9d >> (bVar20 & 0x3f);
          if ((uVar23 < (uint)uVar43) && (*puVar35 == uVar40)) {
            puVar29 = puVar45 + 1;
            puVar25 = puVar35 + 1;
            puVar47 = puVar29;
            if (puVar1 <= puVar29) goto LAB_0014dca7;
            if (*puVar25 != *puVar29) {
              uVar40 = *puVar29 ^ *puVar25;
              uVar46 = 0;
              if (uVar40 != 0) {
                for (; (uVar40 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                }
              }
              local_88 = uVar46 >> 3 & 0x1fffffff;
              goto LAB_0014dcf6;
            }
            lVar42 = 0;
            goto LAB_0014d96e;
          }
          uVar43 = (ulong)pUVar12[uVar33];
          puVar35 = (ulong *)(pBVar11 + uVar43);
          if ((uVar23 < uVar9) && (piVar22 = (int *)(pBVar11 + uVar41), *piVar22 == (int)*puVar45))
          break;
          if (puVar25 <= puVar18) {
            uVar39 = uVar39 + 1;
            puVar25 = puVar25 + 0x20;
          }
          puVar29 = (ulong *)((long)puVar18 + uVar39);
          uVar40 = uVar24;
          puVar45 = puVar18;
          if (puVar17 < (ulong *)((long)puVar18 + uVar39)) goto LAB_0014ef6e;
        }
        if ((uVar23 < pUVar12[uVar33]) && (*puVar35 == uVar24)) {
          puVar45 = puVar18 + 1;
          puVar29 = puVar35 + 1;
          puVar25 = puVar45;
          if (puVar45 < puVar1) {
            if (*puVar29 == *puVar45) {
              lVar42 = 0;
              do {
                puVar29 = (ulong *)((long)puVar18 + lVar42 + 0x10);
                if (puVar1 <= puVar29) {
                  puVar29 = (ulong *)(pBVar11 + lVar42 + uVar43 + 0x10);
                  puVar25 = (ulong *)((long)puVar18 + lVar42 + 0x10);
                  goto LAB_0014de2a;
                }
                lVar36 = lVar42 + uVar43 + 0x10;
                uVar46 = *puVar29;
                lVar42 = lVar42 + 8;
              } while (*(ulong *)(pBVar11 + lVar36) == uVar46);
              uVar46 = uVar46 ^ *(ulong *)(pBVar11 + lVar36);
              uVar40 = 0;
              if (uVar46 != 0) {
                for (; (uVar46 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                }
              }
              local_88 = (uVar40 >> 3 & 0x1fffffff) + lVar42;
            }
            else {
              uVar40 = *puVar45 ^ *puVar29;
              uVar46 = 0;
              if (uVar40 != 0) {
                for (; (uVar40 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                }
              }
              local_88 = uVar46 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_0014de2a:
            if ((puVar25 < puVar2) && ((int)*puVar29 == (int)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 4);
              puVar29 = (ulong *)((long)puVar29 + 4);
            }
            if ((puVar25 < puVar3) && ((short)*puVar29 == (short)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 2);
              puVar29 = (ulong *)((long)puVar29 + 2);
            }
            if (puVar25 < puVar5) {
              puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar29 == (char)*puVar25));
            }
            local_88 = (long)puVar25 - (long)puVar45;
          }
          local_88 = local_88 + 8;
          uVar24 = (long)puVar18 - (long)puVar35;
          puVar45 = puVar18;
          if (src < puVar18) {
            puVar45 = (ulong *)(pBVar11 + (uVar43 - 1));
            puVar29 = (ulong *)((long)puVar18 + -1);
            do {
              if ((char)*puVar29 != (char)*puVar45) {
                puVar45 = (ulong *)((long)puVar29 + 1);
                goto LAB_0014dec8;
              }
              local_88 = local_88 + 1;
              puVar25 = (ulong *)((long)puVar29 + -1);
            } while ((src < puVar29) &&
                    (bVar15 = puVar28 < puVar45, puVar45 = (ulong *)((long)puVar45 + -1),
                    puVar29 = puVar25, bVar15));
LAB_0014deb3:
            puVar45 = (ulong *)((long)puVar25 + 1);
          }
        }
        else {
          puVar29 = (ulong *)((long)puVar45 + 4);
          puVar25 = (ulong *)(piVar22 + 1);
          puVar35 = puVar29;
          if (puVar29 < puVar1) {
            if (*puVar25 == *puVar29) {
              lVar42 = 0;
              do {
                puVar25 = (ulong *)((long)puVar45 + lVar42 + 0xc);
                if (puVar1 <= puVar25) {
                  puVar25 = (ulong *)(pBVar11 + lVar42 + uVar41 + 0xc);
                  puVar35 = (ulong *)((long)puVar45 + lVar42 + 0xc);
                  goto LAB_0014dd6c;
                }
                lVar36 = lVar42 + uVar41 + 0xc;
                uVar46 = *puVar25;
                lVar42 = lVar42 + 8;
              } while (*(ulong *)(pBVar11 + lVar36) == uVar46);
              uVar46 = uVar46 ^ *(ulong *)(pBVar11 + lVar36);
              uVar40 = 0;
              if (uVar46 != 0) {
                for (; (uVar46 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                }
              }
              local_88 = (uVar40 >> 3 & 0x1fffffff) + lVar42;
            }
            else {
              uVar40 = *puVar29 ^ *puVar25;
              uVar46 = 0;
              if (uVar40 != 0) {
                for (; (uVar40 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                }
              }
              local_88 = uVar46 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_0014dd6c:
            if ((puVar35 < puVar2) && ((int)*puVar25 == (int)*puVar35)) {
              puVar35 = (ulong *)((long)puVar35 + 4);
              puVar25 = (ulong *)((long)puVar25 + 4);
            }
            if ((puVar35 < puVar3) && ((short)*puVar25 == (short)*puVar35)) {
              puVar35 = (ulong *)((long)puVar35 + 2);
              puVar25 = (ulong *)((long)puVar25 + 2);
            }
            if (puVar35 < puVar5) {
              puVar35 = (ulong *)((long)puVar35 + (ulong)((char)*puVar25 == (char)*puVar35));
            }
            local_88 = (long)puVar35 - (long)puVar29;
          }
          local_88 = local_88 + 4;
          uVar24 = (long)puVar45 - (long)piVar22;
          if (src < puVar45) {
            puVar45 = (ulong *)((long)puVar45 + -1);
            puVar29 = (ulong *)(pBVar11 + (uVar41 - 1));
            do {
              if ((char)*puVar45 != (char)*puVar29) {
                puVar45 = (ulong *)((long)puVar45 + 1);
                goto LAB_0014dec8;
              }
              local_88 = local_88 + 1;
              puVar25 = (ulong *)((long)puVar45 + -1);
            } while ((src < puVar45) &&
                    (bVar15 = puVar28 < puVar29, puVar45 = puVar25,
                    puVar29 = (ulong *)((long)puVar29 + -1), bVar15));
            goto LAB_0014deb3;
          }
        }
        goto LAB_0014dec8;
      }
      goto LAB_0014f08b;
    }
  }
  else if (uVar9 == 6) {
    if (puVar29 <= puVar17) {
      uVar37 = (ms->cParams).hashLog;
      if ((uVar37 < 0x21) && (uVar9 = (ms->cParams).chainLog, uVar9 < 0x21)) {
        bVar20 = 0x40 - (char)uVar37;
        bVar21 = 0x40 - (char)uVar9;
        puVar1 = (ulong *)((long)puVar5 - 7);
        puVar2 = (ulong *)((long)puVar5 - 3);
        puVar3 = (ulong *)((long)puVar5 - 1);
        puVar4 = puVar5 + -4;
LAB_0014cb67:
        uVar37 = (uint)uVar46;
        uVar33 = *puVar45 * -0x30e44323485a9b9d >> (bVar20 & 0x3f);
        puVar25 = puVar45 + 0x20;
        uVar43 = (ulong)pUVar12[uVar33];
        puVar35 = (ulong *)(pBVar11 + uVar43);
        lVar42 = -(ulong)uVar38;
        uVar39 = 1;
        uVar40 = *puVar45;
        while( true ) {
          puVar18 = puVar29;
          uVar24 = uVar40 * -0x30e4432340650000 >> (bVar21 & 0x3f);
          uVar9 = pUVar13[uVar24];
          uVar41 = (ulong)uVar9;
          UVar27 = (int)puVar45 - iVar44;
          pUVar13[uVar24] = UVar27;
          pUVar12[uVar33] = UVar27;
          if ((uVar38 != 0) && (*(int *)((long)puVar45 + lVar42 + 1) == *(int *)((long)puVar45 + 1))
             ) {
            puVar29 = (ulong *)((long)puVar45 + 5);
            puVar35 = (ulong *)((long)puVar45 + lVar42 + 5);
            puVar25 = puVar29;
            if (puVar1 <= puVar29) goto LAB_0014ce8e;
            if (*puVar35 != *puVar29) {
              uVar33 = *puVar29 ^ *puVar35;
              uVar40 = 0;
              if (uVar33 != 0) {
                for (; (uVar33 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                }
              }
              uVar40 = uVar40 >> 3 & 0x1fffffff;
              goto LAB_0014ced8;
            }
            lVar36 = 0;
            goto LAB_0014ccc9;
          }
          uVar24 = *puVar18;
          uVar33 = uVar24 * -0x30e44323485a9b9d >> (bVar20 & 0x3f);
          if ((uVar23 < (uint)uVar43) && (*puVar35 == uVar40)) {
            puVar29 = puVar45 + 1;
            puVar25 = puVar35 + 1;
            puVar47 = puVar29;
            if (puVar1 <= puVar29) goto LAB_0014d06f;
            if (*puVar25 != *puVar29) {
              uVar40 = *puVar29 ^ *puVar25;
              uVar46 = 0;
              if (uVar40 != 0) {
                for (; (uVar40 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                }
              }
              local_e0 = uVar46 >> 3 & 0x1fffffff;
              goto LAB_0014d0c3;
            }
            lVar42 = 0;
            goto LAB_0014cd31;
          }
          uVar43 = (ulong)pUVar12[uVar33];
          puVar35 = (ulong *)(pBVar11 + uVar43);
          if ((uVar23 < uVar9) && (piVar22 = (int *)(pBVar11 + uVar41), *piVar22 == (int)*puVar45))
          break;
          if (puVar25 <= puVar18) {
            uVar39 = uVar39 + 1;
            puVar25 = puVar25 + 0x20;
          }
          puVar29 = (ulong *)((long)puVar18 + uVar39);
          uVar40 = uVar24;
          puVar45 = puVar18;
          if (puVar17 < (ulong *)((long)puVar18 + uVar39)) goto LAB_0014ef6e;
        }
        if ((uVar23 < pUVar12[uVar33]) && (*puVar35 == uVar24)) {
          puVar45 = puVar18 + 1;
          puVar29 = puVar35 + 1;
          puVar25 = puVar45;
          if (puVar45 < puVar1) {
            if (*puVar29 == *puVar45) {
              lVar42 = 0;
              do {
                puVar29 = (ulong *)((long)puVar18 + lVar42 + 0x10);
                if (puVar1 <= puVar29) {
                  puVar29 = (ulong *)(pBVar11 + lVar42 + uVar43 + 0x10);
                  puVar25 = (ulong *)((long)puVar18 + lVar42 + 0x10);
                  goto LAB_0014d1fe;
                }
                lVar36 = lVar42 + uVar43 + 0x10;
                uVar46 = *puVar29;
                lVar42 = lVar42 + 8;
              } while (*(ulong *)(pBVar11 + lVar36) == uVar46);
              uVar46 = uVar46 ^ *(ulong *)(pBVar11 + lVar36);
              uVar40 = 0;
              if (uVar46 != 0) {
                for (; (uVar46 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                }
              }
              local_e0 = (uVar40 >> 3 & 0x1fffffff) + lVar42;
            }
            else {
              uVar40 = *puVar45 ^ *puVar29;
              uVar46 = 0;
              if (uVar40 != 0) {
                for (; (uVar40 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                }
              }
              local_e0 = uVar46 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_0014d1fe:
            if ((puVar25 < puVar2) && ((int)*puVar29 == (int)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 4);
              puVar29 = (ulong *)((long)puVar29 + 4);
            }
            if ((puVar25 < puVar3) && ((short)*puVar29 == (short)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 2);
              puVar29 = (ulong *)((long)puVar29 + 2);
            }
            if (puVar25 < puVar5) {
              puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar29 == (char)*puVar25));
            }
            local_e0 = (long)puVar25 - (long)puVar45;
          }
          local_e0 = local_e0 + 8;
          uVar24 = (long)puVar18 - (long)puVar35;
          puVar45 = puVar18;
          if (src < puVar18) {
            puVar29 = (ulong *)(pBVar11 + (uVar43 - 1));
            do {
              puVar25 = (ulong *)((long)puVar45 + -1);
              if ((*(char *)puVar25 != (char)*puVar29) ||
                 (local_e0 = local_e0 + 1, puVar45 = puVar25, puVar25 <= src)) break;
              bVar15 = puVar28 < puVar29;
              puVar29 = (ulong *)((long)puVar29 + -1);
            } while (bVar15);
          }
        }
        else {
          puVar29 = (ulong *)((long)puVar45 + 4);
          puVar25 = (ulong *)(piVar22 + 1);
          puVar35 = puVar29;
          if (puVar29 < puVar1) {
            if (*puVar25 == *puVar29) {
              lVar42 = 0;
              do {
                puVar25 = (ulong *)((long)puVar45 + lVar42 + 0xc);
                if (puVar1 <= puVar25) {
                  puVar25 = (ulong *)(pBVar11 + lVar42 + uVar41 + 0xc);
                  puVar35 = (ulong *)((long)puVar45 + lVar42 + 0xc);
                  goto LAB_0014d139;
                }
                lVar36 = lVar42 + uVar41 + 0xc;
                uVar46 = *puVar25;
                lVar42 = lVar42 + 8;
              } while (*(ulong *)(pBVar11 + lVar36) == uVar46);
              uVar46 = uVar46 ^ *(ulong *)(pBVar11 + lVar36);
              uVar40 = 0;
              if (uVar46 != 0) {
                for (; (uVar46 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                }
              }
              local_e0 = (uVar40 >> 3 & 0x1fffffff) + lVar42;
            }
            else {
              uVar40 = *puVar29 ^ *puVar25;
              uVar46 = 0;
              if (uVar40 != 0) {
                for (; (uVar40 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                }
              }
              local_e0 = uVar46 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_0014d139:
            if ((puVar35 < puVar2) && ((int)*puVar25 == (int)*puVar35)) {
              puVar35 = (ulong *)((long)puVar35 + 4);
              puVar25 = (ulong *)((long)puVar25 + 4);
            }
            if ((puVar35 < puVar3) && ((short)*puVar25 == (short)*puVar35)) {
              puVar35 = (ulong *)((long)puVar35 + 2);
              puVar25 = (ulong *)((long)puVar25 + 2);
            }
            if (puVar35 < puVar5) {
              puVar35 = (ulong *)((long)puVar35 + (ulong)((char)*puVar25 == (char)*puVar35));
            }
            local_e0 = (long)puVar35 - (long)puVar29;
          }
          local_e0 = local_e0 + 4;
          uVar24 = (long)puVar45 - (long)piVar22;
          if (src < puVar45) {
            puVar29 = (ulong *)(pBVar11 + (uVar41 - 1));
            do {
              puVar25 = (ulong *)((long)puVar45 + -1);
              if ((*(char *)puVar25 != (char)*puVar29) ||
                 (local_e0 = local_e0 + 1, puVar45 = puVar25, puVar25 <= src)) break;
              bVar15 = puVar28 < puVar29;
              puVar29 = (ulong *)((long)puVar29 + -1);
            } while (bVar15);
          }
        }
        goto LAB_0014d2a1;
      }
      goto LAB_0014f08b;
    }
  }
  else if (uVar9 == 7) {
    if (puVar29 <= puVar17) {
      uVar37 = (ms->cParams).hashLog;
      if ((uVar37 < 0x21) && (uVar9 = (ms->cParams).chainLog, uVar9 < 0x21)) {
        bVar20 = 0x40 - (char)uVar37;
        bVar21 = 0x40 - (char)uVar9;
        puVar1 = (ulong *)((long)puVar5 - 7);
        puVar2 = (ulong *)((long)puVar5 - 3);
        puVar3 = (ulong *)((long)puVar5 - 1);
        puVar4 = puVar5 + -4;
LAB_0014bf28:
        uVar37 = (uint)uVar46;
        uVar33 = *puVar45 * -0x30e44323485a9b9d >> (bVar20 & 0x3f);
        puVar25 = puVar45 + 0x20;
        uVar43 = (ulong)pUVar12[uVar33];
        puVar35 = (ulong *)(pBVar11 + uVar43);
        lVar42 = -(ulong)uVar38;
        uVar39 = 1;
        uVar40 = *puVar45;
        while( true ) {
          puVar18 = puVar29;
          uVar24 = uVar40 * -0x30e44323405a9d00 >> (bVar21 & 0x3f);
          uVar9 = pUVar13[uVar24];
          uVar41 = (ulong)uVar9;
          UVar27 = (int)puVar45 - iVar44;
          pUVar13[uVar24] = UVar27;
          pUVar12[uVar33] = UVar27;
          if ((uVar38 != 0) && (*(int *)((long)puVar45 + lVar42 + 1) == *(int *)((long)puVar45 + 1))
             ) {
            puVar29 = (ulong *)((long)puVar45 + 5);
            puVar35 = (ulong *)((long)puVar45 + lVar42 + 5);
            puVar25 = puVar29;
            if (puVar1 <= puVar29) goto LAB_0014c24f;
            if (*puVar35 != *puVar29) {
              uVar33 = *puVar29 ^ *puVar35;
              uVar40 = 0;
              if (uVar33 != 0) {
                for (; (uVar33 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                }
              }
              uVar40 = uVar40 >> 3 & 0x1fffffff;
              goto LAB_0014c299;
            }
            lVar36 = 0;
            goto LAB_0014c08a;
          }
          uVar24 = *puVar18;
          uVar33 = uVar24 * -0x30e44323485a9b9d >> (bVar20 & 0x3f);
          if ((uVar23 < (uint)uVar43) && (*puVar35 == uVar40)) {
            puVar29 = puVar45 + 1;
            puVar25 = puVar35 + 1;
            puVar47 = puVar29;
            if (puVar1 <= puVar29) goto LAB_0014c430;
            if (*puVar25 != *puVar29) {
              uVar40 = *puVar29 ^ *puVar25;
              uVar46 = 0;
              if (uVar40 != 0) {
                for (; (uVar40 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                }
              }
              local_e0 = uVar46 >> 3 & 0x1fffffff;
              goto LAB_0014c484;
            }
            lVar42 = 0;
            goto LAB_0014c0f2;
          }
          uVar43 = (ulong)pUVar12[uVar33];
          puVar35 = (ulong *)(pBVar11 + uVar43);
          if ((uVar23 < uVar9) && (piVar22 = (int *)(pBVar11 + uVar41), *piVar22 == (int)*puVar45))
          break;
          if (puVar25 <= puVar18) {
            uVar39 = uVar39 + 1;
            puVar25 = puVar25 + 0x20;
          }
          puVar29 = (ulong *)((long)puVar18 + uVar39);
          uVar40 = uVar24;
          puVar45 = puVar18;
          if (puVar17 < (ulong *)((long)puVar18 + uVar39)) goto LAB_0014ef6e;
        }
        if ((uVar23 < pUVar12[uVar33]) && (*puVar35 == uVar24)) {
          puVar45 = puVar18 + 1;
          puVar29 = puVar35 + 1;
          puVar25 = puVar45;
          if (puVar45 < puVar1) {
            if (*puVar29 == *puVar45) {
              lVar42 = 0;
              do {
                puVar29 = (ulong *)((long)puVar18 + lVar42 + 0x10);
                if (puVar1 <= puVar29) {
                  puVar29 = (ulong *)(pBVar11 + lVar42 + uVar43 + 0x10);
                  puVar25 = (ulong *)((long)puVar18 + lVar42 + 0x10);
                  goto LAB_0014c5bf;
                }
                lVar36 = lVar42 + uVar43 + 0x10;
                uVar46 = *puVar29;
                lVar42 = lVar42 + 8;
              } while (*(ulong *)(pBVar11 + lVar36) == uVar46);
              uVar46 = uVar46 ^ *(ulong *)(pBVar11 + lVar36);
              uVar40 = 0;
              if (uVar46 != 0) {
                for (; (uVar46 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                }
              }
              local_e0 = (uVar40 >> 3 & 0x1fffffff) + lVar42;
            }
            else {
              uVar40 = *puVar45 ^ *puVar29;
              uVar46 = 0;
              if (uVar40 != 0) {
                for (; (uVar40 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                }
              }
              local_e0 = uVar46 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_0014c5bf:
            if ((puVar25 < puVar2) && ((int)*puVar29 == (int)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 4);
              puVar29 = (ulong *)((long)puVar29 + 4);
            }
            if ((puVar25 < puVar3) && ((short)*puVar29 == (short)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 2);
              puVar29 = (ulong *)((long)puVar29 + 2);
            }
            if (puVar25 < puVar5) {
              puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar29 == (char)*puVar25));
            }
            local_e0 = (long)puVar25 - (long)puVar45;
          }
          local_e0 = local_e0 + 8;
          uVar24 = (long)puVar18 - (long)puVar35;
          puVar45 = puVar18;
          if (src < puVar18) {
            puVar29 = (ulong *)(pBVar11 + (uVar43 - 1));
            do {
              puVar25 = (ulong *)((long)puVar45 + -1);
              if ((*(char *)puVar25 != (char)*puVar29) ||
                 (local_e0 = local_e0 + 1, puVar45 = puVar25, puVar25 <= src)) break;
              bVar15 = puVar28 < puVar29;
              puVar29 = (ulong *)((long)puVar29 + -1);
            } while (bVar15);
          }
        }
        else {
          puVar29 = (ulong *)((long)puVar45 + 4);
          puVar25 = (ulong *)(piVar22 + 1);
          puVar35 = puVar29;
          if (puVar29 < puVar1) {
            if (*puVar25 == *puVar29) {
              lVar42 = 0;
              do {
                puVar25 = (ulong *)((long)puVar45 + lVar42 + 0xc);
                if (puVar1 <= puVar25) {
                  puVar25 = (ulong *)(pBVar11 + lVar42 + uVar41 + 0xc);
                  puVar35 = (ulong *)((long)puVar45 + lVar42 + 0xc);
                  goto LAB_0014c4fa;
                }
                lVar36 = lVar42 + uVar41 + 0xc;
                uVar46 = *puVar25;
                lVar42 = lVar42 + 8;
              } while (*(ulong *)(pBVar11 + lVar36) == uVar46);
              uVar46 = uVar46 ^ *(ulong *)(pBVar11 + lVar36);
              uVar40 = 0;
              if (uVar46 != 0) {
                for (; (uVar46 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                }
              }
              local_e0 = (uVar40 >> 3 & 0x1fffffff) + lVar42;
            }
            else {
              uVar40 = *puVar29 ^ *puVar25;
              uVar46 = 0;
              if (uVar40 != 0) {
                for (; (uVar40 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                }
              }
              local_e0 = uVar46 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_0014c4fa:
            if ((puVar35 < puVar2) && ((int)*puVar25 == (int)*puVar35)) {
              puVar35 = (ulong *)((long)puVar35 + 4);
              puVar25 = (ulong *)((long)puVar25 + 4);
            }
            if ((puVar35 < puVar3) && ((short)*puVar25 == (short)*puVar35)) {
              puVar35 = (ulong *)((long)puVar35 + 2);
              puVar25 = (ulong *)((long)puVar25 + 2);
            }
            if (puVar35 < puVar5) {
              puVar35 = (ulong *)((long)puVar35 + (ulong)((char)*puVar25 == (char)*puVar35));
            }
            local_e0 = (long)puVar35 - (long)puVar29;
          }
          local_e0 = local_e0 + 4;
          uVar24 = (long)puVar45 - (long)piVar22;
          if (src < puVar45) {
            puVar29 = (ulong *)(pBVar11 + (uVar41 - 1));
            do {
              puVar25 = (ulong *)((long)puVar45 + -1);
              if ((*(char *)puVar25 != (char)*puVar29) ||
                 (local_e0 = local_e0 + 1, puVar45 = puVar25, puVar25 <= src)) break;
              bVar15 = puVar28 < puVar29;
              puVar29 = (ulong *)((long)puVar29 + -1);
            } while (bVar15);
          }
        }
        goto LAB_0014c662;
      }
LAB_0014f08b:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
    }
  }
  else if (puVar29 <= puVar17) {
    uVar37 = (ms->cParams).hashLog;
    if ((uVar37 < 0x21) && (uVar9 = (ms->cParams).chainLog, uVar9 < 0x21)) {
      bVar20 = 0x40 - (char)uVar37;
      bVar21 = 0x20 - (char)uVar9;
      puVar1 = (ulong *)((long)puVar5 - 7);
      puVar2 = (ulong *)((long)puVar5 - 3);
      puVar3 = (ulong *)((long)puVar5 - 1);
      puVar4 = puVar5 + -4;
LAB_0014e3bd:
      uVar37 = (uint)uVar46;
      uVar40 = *puVar45;
      uVar33 = uVar40 * -0x30e44323485a9b9d >> (bVar20 & 0x3f);
      puVar25 = puVar45 + 0x20;
      uVar39 = (ulong)pUVar12[uVar33];
      puVar35 = (ulong *)(pBVar11 + uVar39);
      lVar42 = -(ulong)uVar38;
      uVar43 = 1;
      while( true ) {
        puVar18 = puVar29;
        uVar31 = (uint)((int)uVar40 * -0x61c8864f) >> (bVar21 & 0x1f);
        uVar9 = pUVar13[uVar31];
        uVar24 = (ulong)uVar9;
        UVar27 = (int)puVar45 - iVar44;
        pUVar13[uVar31] = UVar27;
        pUVar12[uVar33] = UVar27;
        if ((uVar38 != 0) && (*(int *)((long)puVar45 + lVar42 + 1) == *(int *)((long)puVar45 + 1)))
        {
          puVar29 = (ulong *)((long)puVar45 + 5);
          puVar35 = (ulong *)((long)puVar45 + lVar42 + 5);
          puVar25 = puVar29;
          if (puVar1 <= puVar29) goto LAB_0014e6dd;
          if (*puVar35 != *puVar29) {
            uVar33 = *puVar29 ^ *puVar35;
            uVar40 = 0;
            if (uVar33 != 0) {
              for (; (uVar33 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
              }
            }
            uVar40 = uVar40 >> 3 & 0x1fffffff;
            goto LAB_0014e727;
          }
          lVar36 = 0;
          goto LAB_0014e511;
        }
        uVar40 = *puVar18;
        uVar33 = uVar40 * -0x30e44323485a9b9d >> (bVar20 & 0x3f);
        if ((uVar23 < (uint)uVar39) && (*puVar35 == *puVar45)) {
          puVar29 = puVar45 + 1;
          puVar25 = puVar35 + 1;
          puVar47 = puVar29;
          if (puVar1 <= puVar29) goto LAB_0014e8bb;
          if (*puVar25 != *puVar29) {
            uVar40 = *puVar29 ^ *puVar25;
            uVar46 = 0;
            if (uVar40 != 0) {
              for (; (uVar40 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
              }
            }
            uVar41 = uVar46 >> 3 & 0x1fffffff;
            goto LAB_0014e91c;
          }
          lVar42 = 0;
          goto LAB_0014e57c;
        }
        uVar39 = (ulong)pUVar12[uVar33];
        puVar35 = (ulong *)(pBVar11 + uVar39);
        if ((uVar23 < uVar9) && (piVar22 = (int *)(pBVar11 + uVar24), *piVar22 == (int)*puVar45))
        break;
        if (puVar25 <= puVar18) {
          uVar43 = uVar43 + 1;
          puVar25 = puVar25 + 0x20;
        }
        puVar29 = (ulong *)((long)puVar18 + uVar43);
        puVar45 = puVar18;
        if (puVar17 < (ulong *)((long)puVar18 + uVar43)) goto LAB_0014ef6e;
      }
      if ((uVar23 < pUVar12[uVar33]) && (*puVar35 == uVar40)) {
        puVar45 = puVar18 + 1;
        puVar29 = puVar35 + 1;
        puVar25 = puVar45;
        if (puVar45 < puVar1) {
          if (*puVar29 == *puVar45) {
            lVar42 = 0;
            do {
              puVar29 = (ulong *)((long)puVar18 + lVar42 + 0x10);
              if (puVar1 <= puVar29) {
                puVar29 = (ulong *)(pBVar11 + lVar42 + uVar39 + 0x10);
                puVar25 = (ulong *)((long)puVar18 + lVar42 + 0x10);
                goto LAB_0014ea6c;
              }
              lVar36 = lVar42 + uVar39 + 0x10;
              uVar46 = *puVar29;
              lVar42 = lVar42 + 8;
            } while (*(ulong *)(pBVar11 + lVar36) == uVar46);
            uVar46 = uVar46 ^ *(ulong *)(pBVar11 + lVar36);
            uVar40 = 0;
            if (uVar46 != 0) {
              for (; (uVar46 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
              }
            }
            uVar41 = (uVar40 >> 3 & 0x1fffffff) + lVar42;
          }
          else {
            uVar40 = *puVar45 ^ *puVar29;
            uVar46 = 0;
            if (uVar40 != 0) {
              for (; (uVar40 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
              }
            }
            uVar41 = uVar46 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_0014ea6c:
          if ((puVar25 < puVar2) && ((int)*puVar29 == (int)*puVar25)) {
            puVar25 = (ulong *)((long)puVar25 + 4);
            puVar29 = (ulong *)((long)puVar29 + 4);
          }
          if ((puVar25 < puVar3) && ((short)*puVar29 == (short)*puVar25)) {
            puVar25 = (ulong *)((long)puVar25 + 2);
            puVar29 = (ulong *)((long)puVar29 + 2);
          }
          if (puVar25 < puVar5) {
            puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar29 == (char)*puVar25));
          }
          uVar41 = (long)puVar25 - (long)puVar45;
        }
        uVar41 = uVar41 + 8;
        uVar32 = (long)puVar18 - (long)puVar35;
        puVar45 = puVar18;
        if (src < puVar18) {
          puVar29 = (ulong *)(pBVar11 + (uVar39 - 1));
          do {
            puVar25 = (ulong *)((long)puVar45 + -1);
            if ((*(char *)puVar25 != (char)*puVar29) ||
               (uVar41 = uVar41 + 1, puVar45 = puVar25, puVar25 <= src)) break;
            bVar15 = puVar28 < puVar29;
            puVar29 = (ulong *)((long)puVar29 + -1);
          } while (bVar15);
        }
      }
      else {
        puVar29 = (ulong *)((long)puVar45 + 4);
        puVar25 = (ulong *)(piVar22 + 1);
        puVar35 = puVar29;
        if (puVar29 < puVar1) {
          if (*puVar25 == *puVar29) {
            lVar42 = 0;
            do {
              puVar25 = (ulong *)((long)puVar45 + lVar42 + 0xc);
              if (puVar1 <= puVar25) {
                puVar25 = (ulong *)(pBVar11 + lVar42 + uVar24 + 0xc);
                puVar35 = (ulong *)((long)puVar45 + lVar42 + 0xc);
                goto LAB_0014e98c;
              }
              lVar36 = lVar42 + uVar24 + 0xc;
              uVar46 = *puVar25;
              lVar42 = lVar42 + 8;
            } while (*(ulong *)(pBVar11 + lVar36) == uVar46);
            uVar46 = uVar46 ^ *(ulong *)(pBVar11 + lVar36);
            uVar40 = 0;
            if (uVar46 != 0) {
              for (; (uVar46 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
              }
            }
            uVar41 = (uVar40 >> 3 & 0x1fffffff) + lVar42;
          }
          else {
            uVar40 = *puVar29 ^ *puVar25;
            uVar46 = 0;
            if (uVar40 != 0) {
              for (; (uVar40 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
              }
            }
            uVar41 = uVar46 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_0014e98c:
          if ((puVar35 < puVar2) && ((int)*puVar25 == (int)*puVar35)) {
            puVar35 = (ulong *)((long)puVar35 + 4);
            puVar25 = (ulong *)((long)puVar25 + 4);
          }
          if ((puVar35 < puVar3) && ((short)*puVar25 == (short)*puVar35)) {
            puVar35 = (ulong *)((long)puVar35 + 2);
            puVar25 = (ulong *)((long)puVar25 + 2);
          }
          if (puVar35 < puVar5) {
            puVar35 = (ulong *)((long)puVar35 + (ulong)((char)*puVar25 == (char)*puVar35));
          }
          uVar41 = (long)puVar35 - (long)puVar29;
        }
        uVar41 = uVar41 + 4;
        uVar32 = (long)puVar45 - (long)piVar22;
        if (src < puVar45) {
          puVar29 = (ulong *)(pBVar11 + (uVar24 - 1));
          do {
            puVar25 = (ulong *)((long)puVar45 + -1);
            if ((*(char *)puVar25 != (char)*puVar29) ||
               (uVar41 = uVar41 + 1, puVar45 = puVar25, puVar25 <= src)) break;
            bVar15 = puVar28 < puVar29;
            puVar29 = (ulong *)((long)puVar29 + -1);
          } while (bVar15);
        }
      }
      goto LAB_0014eb21;
    }
    goto LAB_0014f08b;
  }
LAB_0014ef6e:
  if (uVar34 <= uVar30) {
    uVar34 = 0;
  }
  uVar23 = uVar34;
  if (uVar38 != 0) {
    uVar23 = uVar8;
  }
  if (uVar8 <= uVar30) {
    uVar23 = uVar34;
    uVar8 = 0;
  }
  if (uVar38 != 0) {
    uVar8 = uVar38;
  }
  if (uVar37 != 0) {
    uVar23 = uVar37;
  }
  *rep = uVar8;
  rep[1] = uVar23;
  return (long)puVar5 - (long)src;
LAB_0014d901:
  puVar25 = (ulong *)((long)puVar45 + lVar36 + 0xd);
  if (puVar25 < puVar1) goto code_r0x0014d90e;
  puVar35 = (ulong *)((long)puVar45 + lVar42 + lVar36 + 0xd);
  puVar25 = (ulong *)((long)puVar45 + lVar36 + 0xd);
LAB_0014dacb:
  if ((puVar25 < puVar2) && ((int)*puVar35 == (int)*puVar25)) {
    puVar25 = (ulong *)((long)puVar25 + 4);
    puVar35 = (ulong *)((long)puVar35 + 4);
  }
  if ((puVar25 < puVar3) && ((short)*puVar35 == (short)*puVar25)) {
    puVar25 = (ulong *)((long)puVar25 + 2);
    puVar35 = (ulong *)((long)puVar35 + 2);
  }
  if (puVar25 < puVar5) {
    puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar35 == (char)*puVar25));
  }
  uVar40 = (long)puVar25 - (long)puVar29;
  goto LAB_0014db15;
code_r0x0014d90e:
  uVar40 = *(ulong *)((long)puVar45 + lVar36 + lVar42 + 0xd);
  uVar33 = *puVar25;
  lVar36 = lVar36 + 8;
  if (uVar40 != uVar33) goto code_r0x0014d91e;
  goto LAB_0014d901;
code_r0x0014d91e:
  uVar33 = uVar33 ^ uVar40;
  uVar40 = 0;
  if (uVar33 != 0) {
    for (; (uVar33 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
    }
  }
  uVar40 = (uVar40 >> 3 & 0x1fffffff) + lVar36;
LAB_0014db15:
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_0014eff0;
  if (0x20000 < seqStore->maxNbLit) goto LAB_0014f00f;
  puVar45 = (ulong *)((long)puVar45 + 1);
  uVar33 = (long)puVar45 - (long)src;
  puVar29 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar29 + uVar33)) goto LAB_0014f04d;
  if (puVar5 < puVar45) goto LAB_0014efd1;
  if (puVar4 < puVar45) {
    ZSTD_safecopyLiterals((BYTE *)puVar29,(BYTE *)src,(BYTE *)puVar45,(BYTE *)puVar4);
LAB_0014db85:
    seqStore->lit = seqStore->lit + uVar33;
    if (0xffff < uVar33) {
      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0014f0c9;
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar43 = *(ulong *)((long)src + 8);
    *puVar29 = *src;
    puVar29[1] = uVar43;
    pBVar14 = seqStore->lit;
    if (0x10 < uVar33) {
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar14 + 0x10) + (-0x10 - ((long)src + 0x10))))
      goto LAB_0014f0e8;
      uVar43 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar14 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar14 + 0x18) = uVar43;
      if (0x20 < (long)uVar33) {
        lVar42 = 0;
        do {
          puVar7 = (undefined8 *)((long)src + lVar42 + 0x20);
          uVar16 = puVar7[1];
          pBVar6 = pBVar14 + lVar42 + 0x20;
          *(undefined8 *)pBVar6 = *puVar7;
          *(undefined8 *)(pBVar6 + 8) = uVar16;
          puVar7 = (undefined8 *)((long)src + lVar42 + 0x30);
          uVar16 = puVar7[1];
          *(undefined8 *)(pBVar6 + 0x10) = *puVar7;
          *(undefined8 *)(pBVar6 + 0x18) = uVar16;
          lVar42 = lVar42 + 0x20;
        } while (pBVar6 + 0x20 < pBVar14 + uVar33);
      }
      goto LAB_0014db85;
    }
    seqStore->lit = pBVar14 + uVar33;
  }
  local_88 = uVar40 + 4;
  psVar19 = seqStore->sequences;
  psVar19->litLength = (U16)uVar33;
  psVar19->offBase = 1;
  if (local_88 < 3) goto LAB_0014f02e;
  uVar40 = uVar40 + 1;
  if (0xffff < uVar40) {
    ZVar10 = seqStore->longLengthType;
    goto joined_r0x0014dc6a;
  }
  goto LAB_0014e052;
LAB_0014d96e:
  puVar25 = (ulong *)((long)puVar45 + lVar42 + 0x10);
  if (puVar25 < puVar1) goto code_r0x0014d97b;
  puVar25 = (ulong *)((long)puVar35 + lVar42 + 0x10);
  puVar47 = (ulong *)((long)puVar45 + lVar42 + 0x10);
LAB_0014dca7:
  if ((puVar47 < puVar2) && ((int)*puVar25 == (int)*puVar47)) {
    puVar47 = (ulong *)((long)puVar47 + 4);
    puVar25 = (ulong *)((long)puVar25 + 4);
  }
  if ((puVar47 < puVar3) && ((short)*puVar25 == (short)*puVar47)) {
    puVar47 = (ulong *)((long)puVar47 + 2);
    puVar25 = (ulong *)((long)puVar25 + 2);
  }
  if (puVar47 < puVar5) {
    puVar47 = (ulong *)((long)puVar47 + (ulong)((char)*puVar25 == (char)*puVar47));
  }
  local_88 = (long)puVar47 - (long)puVar29;
  goto LAB_0014dcf6;
code_r0x0014d97b:
  uVar46 = *(ulong *)((long)puVar35 + lVar42 + 0x10);
  uVar40 = *puVar25;
  lVar42 = lVar42 + 8;
  if (uVar46 != uVar40) goto code_r0x0014d98c;
  goto LAB_0014d96e;
code_r0x0014d98c:
  uVar40 = uVar40 ^ uVar46;
  uVar46 = 0;
  if (uVar40 != 0) {
    for (; (uVar40 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
    }
  }
  local_88 = (uVar46 >> 3 & 0x1fffffff) + lVar42;
LAB_0014dcf6:
  local_88 = local_88 + 8;
  uVar24 = (long)puVar45 - (long)puVar35;
  if ((puVar28 < puVar35) && (src < puVar45)) {
    while( true ) {
      puVar35 = (ulong *)((long)puVar35 + -1);
      puVar29 = (ulong *)((long)puVar45 + -1);
      if (*(char *)puVar29 != *(char *)puVar35) break;
      local_88 = local_88 + 1;
      puVar45 = puVar29;
      if ((puVar29 <= src) || (puVar35 <= puVar28)) break;
    }
  }
LAB_0014dec8:
  if (uVar39 < 4) {
    pUVar12[uVar33] = (int)puVar18 - iVar44;
  }
  uVar37 = (uint)uVar24;
  if (uVar37 == 0) goto LAB_0014f0aa;
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_0014eff0;
  if (0x20000 < seqStore->maxNbLit) goto LAB_0014f00f;
  uVar46 = (long)puVar45 - (long)src;
  puVar29 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar29 + uVar46)) goto LAB_0014f04d;
  if (puVar5 < puVar45) goto LAB_0014efd1;
  if (puVar4 < puVar45) {
    ZSTD_safecopyLiterals((BYTE *)puVar29,(BYTE *)src,(BYTE *)puVar45,(BYTE *)puVar4);
LAB_0014df53:
    seqStore->lit = seqStore->lit + uVar46;
    if (0xffff < uVar46) {
      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0014f0c9;
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar40 = *(ulong *)((long)src + 8);
    *puVar29 = *src;
    puVar29[1] = uVar40;
    pBVar14 = seqStore->lit;
    if (0x10 < uVar46) {
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar14 + 0x10) + (-0x10 - ((long)src + 0x10))))
      goto LAB_0014f0e8;
      uVar40 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar14 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar14 + 0x18) = uVar40;
      if (0x20 < (long)uVar46) {
        lVar42 = 0;
        do {
          puVar7 = (undefined8 *)((long)src + lVar42 + 0x20);
          uVar16 = puVar7[1];
          pBVar6 = pBVar14 + lVar42 + 0x20;
          *(undefined8 *)pBVar6 = *puVar7;
          *(undefined8 *)(pBVar6 + 8) = uVar16;
          puVar7 = (undefined8 *)((long)src + lVar42 + 0x30);
          uVar16 = puVar7[1];
          *(undefined8 *)(pBVar6 + 0x10) = *puVar7;
          *(undefined8 *)(pBVar6 + 0x18) = uVar16;
          lVar42 = lVar42 + 0x20;
        } while (pBVar6 + 0x20 < pBVar14 + uVar46);
      }
      goto LAB_0014df53;
    }
    seqStore->lit = pBVar14 + uVar46;
  }
  psVar19 = seqStore->sequences;
  psVar19->litLength = (U16)uVar46;
  psVar19->offBase = uVar37 + 3;
  if (local_88 < 3) goto LAB_0014f02e;
  uVar40 = local_88 - 3;
  if (uVar40 < 0x10000) {
    uVar46 = (ulong)uVar38;
    goto LAB_0014e059;
  }
  ZVar10 = seqStore->longLengthType;
  uVar46 = (ulong)uVar38;
  uVar38 = uVar37;
joined_r0x0014dc6a:
  if (ZVar10 != ZSTD_llt_none) goto LAB_0014f06c;
  seqStore->longLengthType = ZSTD_llt_matchLength;
  seqStore->longLengthPos = (U32)((ulong)((long)psVar19 - (long)seqStore->sequencesStart) >> 3);
LAB_0014e052:
  uVar24 = (ulong)uVar38;
LAB_0014e059:
  src = (void *)((long)puVar45 + local_88);
  psVar19->mlBase = (U16)uVar40;
  psVar19 = psVar19 + 1;
  seqStore->sequences = psVar19;
  if (puVar17 < src) {
    uVar38 = (uint)uVar24;
  }
  else {
    uVar37 = UVar27 + 2;
    lVar42 = *(long *)(pBVar11 + uVar37);
    pUVar12[(ulong)(lVar42 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] = uVar37;
    pUVar12[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] =
         ((int)src + -2) - iVar44;
    pUVar13[(ulong)(lVar42 * -0x30e4432345000000) >> (bVar21 & 0x3f)] = uVar37;
    pUVar13[(ulong)(*(long *)((long)src + -1) * -0x30e4432345000000) >> (bVar21 & 0x3f)] =
         ((int)src + -1) - iVar44;
    uVar40 = uVar46;
    do {
      uVar37 = (uint)uVar40;
      uVar33 = uVar24 & 0xffffffff;
      uVar46 = uVar40;
      uVar38 = (uint)uVar24;
      if ((uVar37 == 0) || ((int)*src != *(int *)((long)src - uVar40))) break;
      lVar42 = -uVar40;
      puVar45 = (ulong *)((long)src + 4);
      puVar25 = (ulong *)((long)src + lVar42 + 4);
      puVar29 = puVar45;
      if (puVar45 < puVar1) {
        if (*puVar25 == *puVar45) {
          lVar36 = 0;
          do {
            puVar29 = (ulong *)((long)src + lVar36 + 0xc);
            if (puVar1 <= puVar29) {
              puVar25 = (ulong *)((long)src + lVar42 + lVar36 + 0xc);
              puVar29 = (ulong *)((long)src + lVar36 + 0xc);
              goto LAB_0014e1b2;
            }
            uVar46 = *(ulong *)((long)src + lVar36 + lVar42 + 0xc);
            uVar43 = *puVar29;
            lVar36 = lVar36 + 8;
          } while (uVar46 == uVar43);
          uVar43 = uVar43 ^ uVar46;
          uVar46 = 0;
          if (uVar43 != 0) {
            for (; (uVar43 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
            }
          }
          uVar46 = (uVar46 >> 3 & 0x1fffffff) + lVar36;
        }
        else {
          uVar43 = *puVar45 ^ *puVar25;
          uVar46 = 0;
          if (uVar43 != 0) {
            for (; (uVar43 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
            }
          }
          uVar46 = uVar46 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_0014e1b2:
        if ((puVar29 < puVar2) && ((int)*puVar25 == (int)*puVar29)) {
          puVar29 = (ulong *)((long)puVar29 + 4);
          puVar25 = (ulong *)((long)puVar25 + 4);
        }
        if ((puVar29 < puVar3) && ((short)*puVar25 == (short)*puVar29)) {
          puVar29 = (ulong *)((long)puVar29 + 2);
          puVar25 = (ulong *)((long)puVar25 + 2);
        }
        if (puVar29 < puVar5) {
          puVar29 = (ulong *)((long)puVar29 + (ulong)((char)*puVar25 == (char)*puVar29));
        }
        uVar46 = (long)puVar29 - (long)puVar45;
      }
      UVar27 = (int)src - iVar44;
      uVar43 = *src;
      pUVar13[uVar43 * -0x30e4432345000000 >> (bVar21 & 0x3f)] = UVar27;
      pUVar12[uVar43 * -0x30e44323485a9b9d >> (bVar20 & 0x3f)] = UVar27;
      if (seqStore->maxNbSeq <= (ulong)((long)psVar19 - (long)seqStore->sequencesStart >> 3))
      goto LAB_0014eff0;
      if (0x20000 < seqStore->maxNbLit) goto LAB_0014f00f;
      puVar45 = (ulong *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < puVar45) goto LAB_0014f04d;
      if (puVar5 < src) goto LAB_0014efd1;
      if (puVar4 < src) {
        ZSTD_safecopyLiterals((BYTE *)puVar45,(BYTE *)src,(BYTE *)src,(BYTE *)puVar4);
      }
      else {
        uVar43 = *(ulong *)((long)src + 8);
        *puVar45 = *src;
        puVar45[1] = uVar43;
      }
      psVar19 = seqStore->sequences;
      psVar19->litLength = 0;
      psVar19->offBase = 1;
      if (uVar46 + 4 < 3) goto LAB_0014f02e;
      if (0xffff < uVar46 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0014f06c;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar19 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar19->mlBase = (U16)(uVar46 + 1);
      psVar19 = psVar19 + 1;
      seqStore->sequences = psVar19;
      src = (void *)((long)src + uVar46 + 4);
      uVar46 = uVar33;
      uVar24 = uVar40;
      uVar40 = uVar33;
      uVar38 = uVar37;
    } while (src <= puVar17);
  }
  puVar29 = (ulong *)((long)src + 1);
  uVar37 = (uint)uVar46;
  puVar45 = (ulong *)src;
  if (puVar17 < puVar29) goto LAB_0014ef6e;
  goto LAB_0014d7ab;
LAB_0014ccc9:
  puVar25 = (ulong *)((long)puVar45 + lVar36 + 0xd);
  if (puVar25 < puVar1) goto code_r0x0014ccd6;
  puVar35 = (ulong *)((long)puVar45 + lVar42 + lVar36 + 0xd);
  puVar25 = (ulong *)((long)puVar45 + lVar36 + 0xd);
LAB_0014ce8e:
  if ((puVar25 < puVar2) && ((int)*puVar35 == (int)*puVar25)) {
    puVar25 = (ulong *)((long)puVar25 + 4);
    puVar35 = (ulong *)((long)puVar35 + 4);
  }
  if ((puVar25 < puVar3) && ((short)*puVar35 == (short)*puVar25)) {
    puVar25 = (ulong *)((long)puVar25 + 2);
    puVar35 = (ulong *)((long)puVar35 + 2);
  }
  if (puVar25 < puVar5) {
    puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar35 == (char)*puVar25));
  }
  uVar40 = (long)puVar25 - (long)puVar29;
  goto LAB_0014ced8;
code_r0x0014ccd6:
  uVar40 = *(ulong *)((long)puVar45 + lVar36 + lVar42 + 0xd);
  uVar33 = *puVar25;
  lVar36 = lVar36 + 8;
  if (uVar40 != uVar33) goto code_r0x0014cce6;
  goto LAB_0014ccc9;
code_r0x0014cce6:
  uVar33 = uVar33 ^ uVar40;
  uVar40 = 0;
  if (uVar33 != 0) {
    for (; (uVar33 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
    }
  }
  uVar40 = (uVar40 >> 3 & 0x1fffffff) + lVar36;
LAB_0014ced8:
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_0014eff0;
  if (0x20000 < seqStore->maxNbLit) goto LAB_0014f00f;
  puVar45 = (ulong *)((long)puVar45 + 1);
  uVar33 = (long)puVar45 - (long)src;
  puVar29 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar29 + uVar33)) goto LAB_0014f04d;
  if (puVar5 < puVar45) goto LAB_0014efd1;
  if (puVar4 < puVar45) {
    ZSTD_safecopyLiterals((BYTE *)puVar29,(BYTE *)src,(BYTE *)puVar45,(BYTE *)puVar4);
LAB_0014cf48:
    seqStore->lit = seqStore->lit + uVar33;
    if (0xffff < uVar33) {
      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0014f0c9;
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar43 = *(ulong *)((long)src + 8);
    *puVar29 = *src;
    puVar29[1] = uVar43;
    pBVar14 = seqStore->lit;
    if (0x10 < uVar33) {
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar14 + 0x10) + (-0x10 - ((long)src + 0x10))))
      goto LAB_0014f0e8;
      uVar43 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar14 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar14 + 0x18) = uVar43;
      if (0x20 < (long)uVar33) {
        lVar42 = 0;
        do {
          puVar7 = (undefined8 *)((long)src + lVar42 + 0x20);
          uVar16 = puVar7[1];
          pBVar6 = pBVar14 + lVar42 + 0x20;
          *(undefined8 *)pBVar6 = *puVar7;
          *(undefined8 *)(pBVar6 + 8) = uVar16;
          puVar7 = (undefined8 *)((long)src + lVar42 + 0x30);
          uVar16 = puVar7[1];
          *(undefined8 *)(pBVar6 + 0x10) = *puVar7;
          *(undefined8 *)(pBVar6 + 0x18) = uVar16;
          lVar42 = lVar42 + 0x20;
        } while (pBVar6 + 0x20 < pBVar14 + uVar33);
      }
      goto LAB_0014cf48;
    }
    seqStore->lit = pBVar14 + uVar33;
  }
  local_e0 = uVar40 + 4;
  psVar19 = seqStore->sequences;
  psVar19->litLength = (U16)uVar33;
  psVar19->offBase = 1;
  if (local_e0 < 3) goto LAB_0014f02e;
  uVar40 = uVar40 + 1;
  if (0xffff < uVar40) {
    ZVar10 = seqStore->longLengthType;
    goto joined_r0x0014d02d;
  }
  goto LAB_0014d426;
LAB_0014cd31:
  puVar25 = (ulong *)((long)puVar45 + lVar42 + 0x10);
  if (puVar25 < puVar1) goto code_r0x0014cd3e;
  puVar25 = (ulong *)((long)puVar35 + lVar42 + 0x10);
  puVar47 = (ulong *)((long)puVar45 + lVar42 + 0x10);
LAB_0014d06f:
  if ((puVar47 < puVar2) && ((int)*puVar25 == (int)*puVar47)) {
    puVar47 = (ulong *)((long)puVar47 + 4);
    puVar25 = (ulong *)((long)puVar25 + 4);
  }
  if ((puVar47 < puVar3) && ((short)*puVar25 == (short)*puVar47)) {
    puVar47 = (ulong *)((long)puVar47 + 2);
    puVar25 = (ulong *)((long)puVar25 + 2);
  }
  if (puVar47 < puVar5) {
    puVar47 = (ulong *)((long)puVar47 + (ulong)((char)*puVar25 == (char)*puVar47));
  }
  local_e0 = (long)puVar47 - (long)puVar29;
  goto LAB_0014d0c3;
code_r0x0014cd3e:
  uVar46 = *(ulong *)((long)puVar35 + lVar42 + 0x10);
  uVar40 = *puVar25;
  lVar42 = lVar42 + 8;
  if (uVar46 != uVar40) goto code_r0x0014cd4f;
  goto LAB_0014cd31;
code_r0x0014cd4f:
  uVar40 = uVar40 ^ uVar46;
  uVar46 = 0;
  if (uVar40 != 0) {
    for (; (uVar40 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
    }
  }
  local_e0 = (uVar46 >> 3 & 0x1fffffff) + lVar42;
LAB_0014d0c3:
  local_e0 = local_e0 + 8;
  uVar24 = (long)puVar45 - (long)puVar35;
  if ((puVar28 < puVar35) && (src < puVar45)) {
    while( true ) {
      puVar35 = (ulong *)((long)puVar35 + -1);
      puVar29 = (ulong *)((long)puVar45 + -1);
      if (*(char *)puVar29 != *(char *)puVar35) break;
      local_e0 = local_e0 + 1;
      puVar45 = puVar29;
      if ((puVar29 <= src) || (puVar35 <= puVar28)) break;
    }
  }
LAB_0014d2a1:
  if (uVar39 < 4) {
    pUVar12[uVar33] = (int)puVar18 - iVar44;
  }
  uVar37 = (uint)uVar24;
  if (uVar37 == 0) goto LAB_0014f0aa;
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_0014eff0;
  if (0x20000 < seqStore->maxNbLit) goto LAB_0014f00f;
  uVar46 = (long)puVar45 - (long)src;
  puVar29 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar29 + uVar46)) goto LAB_0014f04d;
  if (puVar5 < puVar45) goto LAB_0014efd1;
  if (puVar4 < puVar45) {
    ZSTD_safecopyLiterals((BYTE *)puVar29,(BYTE *)src,(BYTE *)puVar45,(BYTE *)puVar4);
LAB_0014d327:
    seqStore->lit = seqStore->lit + uVar46;
    if (0xffff < uVar46) {
      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0014f0c9;
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar40 = *(ulong *)((long)src + 8);
    *puVar29 = *src;
    puVar29[1] = uVar40;
    pBVar14 = seqStore->lit;
    if (0x10 < uVar46) {
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar14 + 0x10) + (-0x10 - ((long)src + 0x10))))
      goto LAB_0014f0e8;
      uVar40 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar14 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar14 + 0x18) = uVar40;
      if (0x20 < (long)uVar46) {
        lVar42 = 0;
        do {
          puVar7 = (undefined8 *)((long)src + lVar42 + 0x20);
          uVar16 = puVar7[1];
          pBVar6 = pBVar14 + lVar42 + 0x20;
          *(undefined8 *)pBVar6 = *puVar7;
          *(undefined8 *)(pBVar6 + 8) = uVar16;
          puVar7 = (undefined8 *)((long)src + lVar42 + 0x30);
          uVar16 = puVar7[1];
          *(undefined8 *)(pBVar6 + 0x10) = *puVar7;
          *(undefined8 *)(pBVar6 + 0x18) = uVar16;
          lVar42 = lVar42 + 0x20;
        } while (pBVar6 + 0x20 < pBVar14 + uVar46);
      }
      goto LAB_0014d327;
    }
    seqStore->lit = pBVar14 + uVar46;
  }
  psVar19 = seqStore->sequences;
  psVar19->litLength = (U16)uVar46;
  psVar19->offBase = uVar37 + 3;
  if (local_e0 < 3) goto LAB_0014f02e;
  uVar40 = local_e0 - 3;
  if (uVar40 < 0x10000) {
    uVar46 = (ulong)uVar38;
    goto LAB_0014d42d;
  }
  ZVar10 = seqStore->longLengthType;
  uVar46 = (ulong)uVar38;
  uVar38 = uVar37;
joined_r0x0014d02d:
  if (ZVar10 != ZSTD_llt_none) goto LAB_0014f06c;
  seqStore->longLengthType = ZSTD_llt_matchLength;
  seqStore->longLengthPos = (U32)((ulong)((long)psVar19 - (long)seqStore->sequencesStart) >> 3);
LAB_0014d426:
  uVar24 = (ulong)uVar38;
LAB_0014d42d:
  src = (void *)((long)puVar45 + local_e0);
  psVar19->mlBase = (U16)uVar40;
  psVar19 = psVar19 + 1;
  seqStore->sequences = psVar19;
  if (puVar17 < src) {
    uVar38 = (uint)uVar24;
  }
  else {
    uVar37 = UVar27 + 2;
    lVar42 = *(long *)(pBVar11 + uVar37);
    pUVar12[(ulong)(lVar42 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] = uVar37;
    pUVar12[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] =
         ((int)src + -2) - iVar44;
    pUVar13[(ulong)(lVar42 * -0x30e4432340650000) >> (bVar21 & 0x3f)] = uVar37;
    pUVar13[(ulong)(*(long *)((long)src + -1) * -0x30e4432340650000) >> (bVar21 & 0x3f)] =
         ((int)src + -1) - iVar44;
    uVar40 = uVar46;
    do {
      uVar37 = (uint)uVar40;
      uVar33 = uVar24 & 0xffffffff;
      uVar46 = uVar40;
      uVar38 = (uint)uVar24;
      if ((uVar37 == 0) || ((int)*src != *(int *)((long)src - uVar40))) break;
      lVar42 = -uVar40;
      puVar45 = (ulong *)((long)src + 4);
      puVar25 = (ulong *)((long)src + lVar42 + 4);
      puVar29 = puVar45;
      if (puVar45 < puVar1) {
        if (*puVar25 == *puVar45) {
          lVar36 = 0;
          do {
            puVar29 = (ulong *)((long)src + lVar36 + 0xc);
            if (puVar1 <= puVar29) {
              puVar25 = (ulong *)((long)src + lVar42 + lVar36 + 0xc);
              puVar29 = (ulong *)((long)src + lVar36 + 0xc);
              goto LAB_0014d586;
            }
            uVar46 = *(ulong *)((long)src + lVar36 + lVar42 + 0xc);
            uVar43 = *puVar29;
            lVar36 = lVar36 + 8;
          } while (uVar46 == uVar43);
          uVar43 = uVar43 ^ uVar46;
          uVar46 = 0;
          if (uVar43 != 0) {
            for (; (uVar43 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
            }
          }
          uVar46 = (uVar46 >> 3 & 0x1fffffff) + lVar36;
        }
        else {
          uVar43 = *puVar45 ^ *puVar25;
          uVar46 = 0;
          if (uVar43 != 0) {
            for (; (uVar43 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
            }
          }
          uVar46 = uVar46 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_0014d586:
        if ((puVar29 < puVar2) && ((int)*puVar25 == (int)*puVar29)) {
          puVar29 = (ulong *)((long)puVar29 + 4);
          puVar25 = (ulong *)((long)puVar25 + 4);
        }
        if ((puVar29 < puVar3) && ((short)*puVar25 == (short)*puVar29)) {
          puVar29 = (ulong *)((long)puVar29 + 2);
          puVar25 = (ulong *)((long)puVar25 + 2);
        }
        if (puVar29 < puVar5) {
          puVar29 = (ulong *)((long)puVar29 + (ulong)((char)*puVar25 == (char)*puVar29));
        }
        uVar46 = (long)puVar29 - (long)puVar45;
      }
      UVar27 = (int)src - iVar44;
      uVar43 = *src;
      pUVar13[uVar43 * -0x30e4432340650000 >> (bVar21 & 0x3f)] = UVar27;
      pUVar12[uVar43 * -0x30e44323485a9b9d >> (bVar20 & 0x3f)] = UVar27;
      if (seqStore->maxNbSeq <= (ulong)((long)psVar19 - (long)seqStore->sequencesStart >> 3))
      goto LAB_0014eff0;
      if (0x20000 < seqStore->maxNbLit) goto LAB_0014f00f;
      puVar45 = (ulong *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < puVar45) goto LAB_0014f04d;
      if (puVar5 < src) goto LAB_0014efd1;
      if (puVar4 < src) {
        ZSTD_safecopyLiterals((BYTE *)puVar45,(BYTE *)src,(BYTE *)src,(BYTE *)puVar4);
      }
      else {
        uVar43 = *(ulong *)((long)src + 8);
        *puVar45 = *src;
        puVar45[1] = uVar43;
      }
      psVar19 = seqStore->sequences;
      psVar19->litLength = 0;
      psVar19->offBase = 1;
      if (uVar46 + 4 < 3) goto LAB_0014f02e;
      if (0xffff < uVar46 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0014f06c;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar19 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar19->mlBase = (U16)(uVar46 + 1);
      psVar19 = psVar19 + 1;
      seqStore->sequences = psVar19;
      src = (void *)((long)src + uVar46 + 4);
      uVar46 = uVar33;
      uVar24 = uVar40;
      uVar40 = uVar33;
      uVar38 = uVar37;
    } while (src <= puVar17);
  }
  puVar29 = (ulong *)((long)src + 1);
  uVar37 = (uint)uVar46;
  puVar45 = (ulong *)src;
  if (puVar17 < puVar29) goto LAB_0014ef6e;
  goto LAB_0014cb67;
LAB_0014e511:
  puVar25 = (ulong *)((long)puVar45 + lVar36 + 0xd);
  if (puVar25 < puVar1) goto code_r0x0014e520;
  puVar35 = (ulong *)((long)puVar45 + lVar42 + lVar36 + 0xd);
  puVar25 = (ulong *)((long)puVar45 + lVar36 + 0xd);
LAB_0014e6dd:
  if ((puVar25 < puVar2) && ((int)*puVar35 == (int)*puVar25)) {
    puVar25 = (ulong *)((long)puVar25 + 4);
    puVar35 = (ulong *)((long)puVar35 + 4);
  }
  if ((puVar25 < puVar3) && ((short)*puVar35 == (short)*puVar25)) {
    puVar25 = (ulong *)((long)puVar25 + 2);
    puVar35 = (ulong *)((long)puVar35 + 2);
  }
  if (puVar25 < puVar5) {
    puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar35 == (char)*puVar25));
  }
  uVar40 = (long)puVar25 - (long)puVar29;
  goto LAB_0014e727;
code_r0x0014e520:
  uVar40 = *(ulong *)((long)puVar45 + lVar36 + lVar42 + 0xd);
  uVar33 = *puVar25;
  lVar36 = lVar36 + 8;
  if (uVar40 != uVar33) goto code_r0x0014e530;
  goto LAB_0014e511;
code_r0x0014e530:
  uVar33 = uVar33 ^ uVar40;
  uVar40 = 0;
  if (uVar33 != 0) {
    for (; (uVar33 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
    }
  }
  uVar40 = (uVar40 >> 3 & 0x1fffffff) + lVar36;
LAB_0014e727:
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_0014eff0;
  if (0x20000 < seqStore->maxNbLit) goto LAB_0014f00f;
  puVar45 = (ulong *)((long)puVar45 + 1);
  uVar33 = (long)puVar45 - (long)src;
  puVar29 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar29 + uVar33)) goto LAB_0014f04d;
  if (puVar5 < puVar45) goto LAB_0014efd1;
  if (puVar4 < puVar45) {
    ZSTD_safecopyLiterals((BYTE *)puVar29,(BYTE *)src,(BYTE *)puVar45,(BYTE *)puVar4);
LAB_0014e797:
    seqStore->lit = seqStore->lit + uVar33;
    if (0xffff < uVar33) {
      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0014f0c9;
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar43 = *(ulong *)((long)src + 8);
    *puVar29 = *src;
    puVar29[1] = uVar43;
    pBVar14 = seqStore->lit;
    if (0x10 < uVar33) {
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar14 + 0x10) + (-0x10 - ((long)src + 0x10))))
      goto LAB_0014f0e8;
      uVar43 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar14 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar14 + 0x18) = uVar43;
      if (0x20 < (long)uVar33) {
        lVar42 = 0;
        do {
          puVar7 = (undefined8 *)((long)src + lVar42 + 0x20);
          uVar16 = puVar7[1];
          pBVar6 = pBVar14 + lVar42 + 0x20;
          *(undefined8 *)pBVar6 = *puVar7;
          *(undefined8 *)(pBVar6 + 8) = uVar16;
          puVar7 = (undefined8 *)((long)src + lVar42 + 0x30);
          uVar16 = puVar7[1];
          *(undefined8 *)(pBVar6 + 0x10) = *puVar7;
          *(undefined8 *)(pBVar6 + 0x18) = uVar16;
          lVar42 = lVar42 + 0x20;
        } while (pBVar6 + 0x20 < pBVar14 + uVar33);
      }
      goto LAB_0014e797;
    }
    seqStore->lit = pBVar14 + uVar33;
  }
  uVar41 = uVar40 + 4;
  psVar19 = seqStore->sequences;
  psVar19->litLength = (U16)uVar33;
  psVar19->offBase = 1;
  if (uVar41 < 3) goto LAB_0014f02e;
  uVar40 = uVar40 + 1;
  if (0xffff < uVar40) {
    ZVar10 = seqStore->longLengthType;
    goto joined_r0x0014e877;
  }
  goto LAB_0014eca2;
LAB_0014e57c:
  puVar25 = (ulong *)((long)puVar45 + lVar42 + 0x10);
  if (puVar25 < puVar1) goto code_r0x0014e58b;
  puVar25 = (ulong *)((long)puVar35 + lVar42 + 0x10);
  puVar47 = (ulong *)((long)puVar45 + lVar42 + 0x10);
LAB_0014e8bb:
  if ((puVar47 < puVar2) && ((int)*puVar25 == (int)*puVar47)) {
    puVar47 = (ulong *)((long)puVar47 + 4);
    puVar25 = (ulong *)((long)puVar25 + 4);
  }
  if ((puVar47 < puVar3) && ((short)*puVar25 == (short)*puVar47)) {
    puVar47 = (ulong *)((long)puVar47 + 2);
    puVar25 = (ulong *)((long)puVar25 + 2);
  }
  if (puVar47 < puVar5) {
    puVar47 = (ulong *)((long)puVar47 + (ulong)((char)*puVar25 == (char)*puVar47));
  }
  uVar41 = (long)puVar47 - (long)puVar29;
  goto LAB_0014e91c;
code_r0x0014e58b:
  uVar46 = *(ulong *)((long)puVar35 + lVar42 + 0x10);
  uVar40 = *puVar25;
  lVar42 = lVar42 + 8;
  if (uVar46 != uVar40) goto code_r0x0014e59c;
  goto LAB_0014e57c;
code_r0x0014e59c:
  uVar40 = uVar40 ^ uVar46;
  uVar46 = 0;
  if (uVar40 != 0) {
    for (; (uVar40 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
    }
  }
  uVar41 = (uVar46 >> 3 & 0x1fffffff) + lVar42;
LAB_0014e91c:
  uVar41 = uVar41 + 8;
  uVar32 = (long)puVar45 - (long)puVar35;
  if ((puVar28 < puVar35) && (src < puVar45)) {
    while( true ) {
      puVar35 = (ulong *)((long)puVar35 + -1);
      puVar29 = (ulong *)((long)puVar45 + -1);
      if (*(char *)puVar29 != *(char *)puVar35) break;
      uVar41 = uVar41 + 1;
      puVar45 = puVar29;
      if ((puVar29 <= src) || (puVar35 <= puVar28)) break;
    }
  }
LAB_0014eb21:
  if (uVar43 < 4) {
    pUVar12[uVar33] = (int)puVar18 - iVar44;
  }
  uVar37 = (uint)uVar32;
  if (uVar37 == 0) goto LAB_0014f0aa;
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_0014eff0;
  if (0x20000 < seqStore->maxNbLit) goto LAB_0014f00f;
  uVar46 = (long)puVar45 - (long)src;
  puVar29 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar29 + uVar46)) goto LAB_0014f04d;
  if (puVar5 < puVar45) goto LAB_0014efd1;
  if (puVar4 < puVar45) {
    ZSTD_safecopyLiterals((BYTE *)puVar29,(BYTE *)src,(BYTE *)puVar45,(BYTE *)puVar4);
LAB_0014eba8:
    seqStore->lit = seqStore->lit + uVar46;
    if (0xffff < uVar46) {
      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0014f0c9;
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar40 = *(ulong *)((long)src + 8);
    *puVar29 = *src;
    puVar29[1] = uVar40;
    pBVar14 = seqStore->lit;
    if (0x10 < uVar46) {
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar14 + 0x10) + (-0x10 - ((long)src + 0x10))))
      goto LAB_0014f0e8;
      uVar40 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar14 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar14 + 0x18) = uVar40;
      if (0x20 < (long)uVar46) {
        lVar42 = 0;
        do {
          puVar7 = (undefined8 *)((long)src + lVar42 + 0x20);
          uVar16 = puVar7[1];
          pBVar6 = pBVar14 + lVar42 + 0x20;
          *(undefined8 *)pBVar6 = *puVar7;
          *(undefined8 *)(pBVar6 + 8) = uVar16;
          puVar7 = (undefined8 *)((long)src + lVar42 + 0x30);
          uVar16 = puVar7[1];
          *(undefined8 *)(pBVar6 + 0x10) = *puVar7;
          *(undefined8 *)(pBVar6 + 0x18) = uVar16;
          lVar42 = lVar42 + 0x20;
        } while (pBVar6 + 0x20 < pBVar14 + uVar46);
      }
      goto LAB_0014eba8;
    }
    seqStore->lit = pBVar14 + uVar46;
  }
  psVar19 = seqStore->sequences;
  psVar19->litLength = (U16)uVar46;
  psVar19->offBase = uVar37 + 3;
  if (uVar41 < 3) goto LAB_0014f02e;
  uVar40 = uVar41 - 3;
  if (uVar40 < 0x10000) {
    uVar46 = (ulong)uVar38;
    goto LAB_0014eca9;
  }
  ZVar10 = seqStore->longLengthType;
  uVar46 = (ulong)uVar38;
  uVar38 = uVar37;
joined_r0x0014e877:
  if (ZVar10 != ZSTD_llt_none) goto LAB_0014f06c;
  seqStore->longLengthType = ZSTD_llt_matchLength;
  seqStore->longLengthPos = (U32)((ulong)((long)psVar19 - (long)seqStore->sequencesStart) >> 3);
LAB_0014eca2:
  uVar32 = (ulong)uVar38;
LAB_0014eca9:
  src = (void *)((long)puVar45 + uVar41);
  psVar19->mlBase = (U16)uVar40;
  psVar19 = psVar19 + 1;
  seqStore->sequences = psVar19;
  if (puVar17 < src) {
    uVar38 = (uint)uVar32;
  }
  else {
    uVar37 = UVar27 + 2;
    pUVar12[(ulong)(*(long *)(pBVar11 + uVar37) * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] = uVar37;
    pUVar12[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] =
         ((int)src + -2) - iVar44;
    pUVar13[(uint)(*(int *)(pBVar11 + uVar37) * -0x61c8864f) >> (bVar21 & 0x1f)] = uVar37;
    pUVar13[(uint)(*(int *)((long)src + -1) * -0x61c8864f) >> (bVar21 & 0x1f)] =
         ((int)src + -1) - iVar44;
    uVar40 = uVar46;
    do {
      uVar37 = (uint)uVar40;
      uVar33 = uVar32 & 0xffffffff;
      uVar46 = uVar40;
      uVar38 = (uint)uVar32;
      if ((uVar37 == 0) || ((int)*src != *(int *)((long)src - uVar40))) break;
      lVar42 = -uVar40;
      puVar45 = (ulong *)((long)src + 4);
      puVar25 = (ulong *)((long)src + lVar42 + 4);
      puVar29 = puVar45;
      if (puVar45 < puVar1) {
        if (*puVar25 == *puVar45) {
          lVar36 = 0;
          do {
            puVar29 = (ulong *)((long)src + lVar36 + 0xc);
            if (puVar1 <= puVar29) {
              puVar25 = (ulong *)((long)src + lVar42 + lVar36 + 0xc);
              puVar29 = (ulong *)((long)src + lVar36 + 0xc);
              goto LAB_0014edf8;
            }
            uVar46 = *(ulong *)((long)src + lVar36 + lVar42 + 0xc);
            uVar43 = *puVar29;
            lVar36 = lVar36 + 8;
          } while (uVar46 == uVar43);
          uVar43 = uVar43 ^ uVar46;
          uVar46 = 0;
          if (uVar43 != 0) {
            for (; (uVar43 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
            }
          }
          uVar46 = (uVar46 >> 3 & 0x1fffffff) + lVar36;
        }
        else {
          uVar43 = *puVar45 ^ *puVar25;
          uVar46 = 0;
          if (uVar43 != 0) {
            for (; (uVar43 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
            }
          }
          uVar46 = uVar46 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_0014edf8:
        if ((puVar29 < puVar2) && ((int)*puVar25 == (int)*puVar29)) {
          puVar29 = (ulong *)((long)puVar29 + 4);
          puVar25 = (ulong *)((long)puVar25 + 4);
        }
        if ((puVar29 < puVar3) && ((short)*puVar25 == (short)*puVar29)) {
          puVar29 = (ulong *)((long)puVar29 + 2);
          puVar25 = (ulong *)((long)puVar25 + 2);
        }
        if (puVar29 < puVar5) {
          puVar29 = (ulong *)((long)puVar29 + (ulong)((char)*puVar25 == (char)*puVar29));
        }
        uVar46 = (long)puVar29 - (long)puVar45;
      }
      UVar27 = (int)src - iVar44;
      pUVar13[(uint)((int)*src * -0x61c8864f) >> (bVar21 & 0x1f)] = UVar27;
      pUVar12[*src * -0x30e44323485a9b9d >> (bVar20 & 0x3f)] = UVar27;
      if (seqStore->maxNbSeq <= (ulong)((long)psVar19 - (long)seqStore->sequencesStart >> 3))
      goto LAB_0014eff0;
      if (0x20000 < seqStore->maxNbLit) goto LAB_0014f00f;
      puVar45 = (ulong *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < puVar45) goto LAB_0014f04d;
      if (puVar5 < src) goto LAB_0014efd1;
      if (puVar4 < src) {
        ZSTD_safecopyLiterals((BYTE *)puVar45,(BYTE *)src,(BYTE *)src,(BYTE *)puVar4);
      }
      else {
        uVar43 = *(ulong *)((long)src + 8);
        *puVar45 = *src;
        puVar45[1] = uVar43;
      }
      psVar19 = seqStore->sequences;
      psVar19->litLength = 0;
      psVar19->offBase = 1;
      if (uVar46 + 4 < 3) goto LAB_0014f02e;
      if (0xffff < uVar46 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0014f06c;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar19 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar19->mlBase = (U16)(uVar46 + 1);
      psVar19 = psVar19 + 1;
      seqStore->sequences = psVar19;
      src = (void *)((long)src + uVar46 + 4);
      uVar46 = uVar33;
      uVar32 = uVar40;
      uVar40 = uVar33;
      uVar38 = uVar37;
    } while (src <= puVar17);
  }
  puVar29 = (ulong *)((long)src + 1);
  uVar37 = (uint)uVar46;
  puVar45 = (ulong *)src;
  if (puVar17 < puVar29) goto LAB_0014ef6e;
  goto LAB_0014e3bd;
LAB_0014c08a:
  puVar25 = (ulong *)((long)puVar45 + lVar36 + 0xd);
  if (puVar25 < puVar1) goto code_r0x0014c097;
  puVar35 = (ulong *)((long)puVar45 + lVar42 + lVar36 + 0xd);
  puVar25 = (ulong *)((long)puVar45 + lVar36 + 0xd);
LAB_0014c24f:
  if ((puVar25 < puVar2) && ((int)*puVar35 == (int)*puVar25)) {
    puVar25 = (ulong *)((long)puVar25 + 4);
    puVar35 = (ulong *)((long)puVar35 + 4);
  }
  if ((puVar25 < puVar3) && ((short)*puVar35 == (short)*puVar25)) {
    puVar25 = (ulong *)((long)puVar25 + 2);
    puVar35 = (ulong *)((long)puVar35 + 2);
  }
  if (puVar25 < puVar5) {
    puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar35 == (char)*puVar25));
  }
  uVar40 = (long)puVar25 - (long)puVar29;
  goto LAB_0014c299;
code_r0x0014c097:
  uVar40 = *(ulong *)((long)puVar45 + lVar36 + lVar42 + 0xd);
  uVar33 = *puVar25;
  lVar36 = lVar36 + 8;
  if (uVar40 != uVar33) goto code_r0x0014c0a7;
  goto LAB_0014c08a;
code_r0x0014c0a7:
  uVar33 = uVar33 ^ uVar40;
  uVar40 = 0;
  if (uVar33 != 0) {
    for (; (uVar33 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
    }
  }
  uVar40 = (uVar40 >> 3 & 0x1fffffff) + lVar36;
LAB_0014c299:
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_0014eff0;
  if (0x20000 < seqStore->maxNbLit) goto LAB_0014f00f;
  puVar45 = (ulong *)((long)puVar45 + 1);
  uVar33 = (long)puVar45 - (long)src;
  puVar29 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar29 + uVar33)) goto LAB_0014f04d;
  if (puVar5 < puVar45) goto LAB_0014efd1;
  if (puVar4 < puVar45) {
    ZSTD_safecopyLiterals((BYTE *)puVar29,(BYTE *)src,(BYTE *)puVar45,(BYTE *)puVar4);
LAB_0014c309:
    seqStore->lit = seqStore->lit + uVar33;
    if (0xffff < uVar33) {
      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0014f0c9;
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar43 = *(ulong *)((long)src + 8);
    *puVar29 = *src;
    puVar29[1] = uVar43;
    pBVar14 = seqStore->lit;
    if (0x10 < uVar33) {
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar14 + 0x10) + (-0x10 - ((long)src + 0x10))))
      goto LAB_0014f0e8;
      uVar43 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar14 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar14 + 0x18) = uVar43;
      if (0x20 < (long)uVar33) {
        lVar42 = 0;
        do {
          puVar7 = (undefined8 *)((long)src + lVar42 + 0x20);
          uVar16 = puVar7[1];
          pBVar6 = pBVar14 + lVar42 + 0x20;
          *(undefined8 *)pBVar6 = *puVar7;
          *(undefined8 *)(pBVar6 + 8) = uVar16;
          puVar7 = (undefined8 *)((long)src + lVar42 + 0x30);
          uVar16 = puVar7[1];
          *(undefined8 *)(pBVar6 + 0x10) = *puVar7;
          *(undefined8 *)(pBVar6 + 0x18) = uVar16;
          lVar42 = lVar42 + 0x20;
        } while (pBVar6 + 0x20 < pBVar14 + uVar33);
      }
      goto LAB_0014c309;
    }
    seqStore->lit = pBVar14 + uVar33;
  }
  local_e0 = uVar40 + 4;
  psVar19 = seqStore->sequences;
  psVar19->litLength = (U16)uVar33;
  psVar19->offBase = 1;
  if (local_e0 < 3) goto LAB_0014f02e;
  uVar40 = uVar40 + 1;
  if (0xffff < uVar40) {
    ZVar10 = seqStore->longLengthType;
    goto joined_r0x0014c3ee;
  }
  goto LAB_0014c7e7;
LAB_0014c0f2:
  puVar25 = (ulong *)((long)puVar45 + lVar42 + 0x10);
  if (puVar25 < puVar1) goto code_r0x0014c0ff;
  puVar25 = (ulong *)((long)puVar35 + lVar42 + 0x10);
  puVar47 = (ulong *)((long)puVar45 + lVar42 + 0x10);
LAB_0014c430:
  if ((puVar47 < puVar2) && ((int)*puVar25 == (int)*puVar47)) {
    puVar47 = (ulong *)((long)puVar47 + 4);
    puVar25 = (ulong *)((long)puVar25 + 4);
  }
  if ((puVar47 < puVar3) && ((short)*puVar25 == (short)*puVar47)) {
    puVar47 = (ulong *)((long)puVar47 + 2);
    puVar25 = (ulong *)((long)puVar25 + 2);
  }
  if (puVar47 < puVar5) {
    puVar47 = (ulong *)((long)puVar47 + (ulong)((char)*puVar25 == (char)*puVar47));
  }
  local_e0 = (long)puVar47 - (long)puVar29;
  goto LAB_0014c484;
code_r0x0014c0ff:
  uVar46 = *(ulong *)((long)puVar35 + lVar42 + 0x10);
  uVar40 = *puVar25;
  lVar42 = lVar42 + 8;
  if (uVar46 != uVar40) goto code_r0x0014c110;
  goto LAB_0014c0f2;
code_r0x0014c110:
  uVar40 = uVar40 ^ uVar46;
  uVar46 = 0;
  if (uVar40 != 0) {
    for (; (uVar40 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
    }
  }
  local_e0 = (uVar46 >> 3 & 0x1fffffff) + lVar42;
LAB_0014c484:
  local_e0 = local_e0 + 8;
  uVar24 = (long)puVar45 - (long)puVar35;
  if ((puVar28 < puVar35) && (src < puVar45)) {
    while( true ) {
      puVar35 = (ulong *)((long)puVar35 + -1);
      puVar29 = (ulong *)((long)puVar45 + -1);
      if (*(char *)puVar29 != *(char *)puVar35) break;
      local_e0 = local_e0 + 1;
      puVar45 = puVar29;
      if ((puVar29 <= src) || (puVar35 <= puVar28)) break;
    }
  }
LAB_0014c662:
  if (uVar39 < 4) {
    pUVar12[uVar33] = (int)puVar18 - iVar44;
  }
  uVar37 = (uint)uVar24;
  if (uVar37 == 0) {
LAB_0014f0aa:
    __assert_fail("(offset)>0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x6dc9,
                  "size_t ZSTD_compressBlock_doubleFast_noDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                 );
  }
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) {
LAB_0014eff0:
    __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x468b,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (0x20000 < seqStore->maxNbLit) {
LAB_0014f00f:
    __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x468d,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  uVar46 = (long)puVar45 - (long)src;
  puVar29 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar29 + uVar46)) {
LAB_0014f04d:
    __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x468e,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (puVar5 < puVar45) {
LAB_0014efd1:
    __assert_fail("literals + litLength <= litLimit",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x468f,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (puVar4 < puVar45) {
    ZSTD_safecopyLiterals((BYTE *)puVar29,(BYTE *)src,(BYTE *)puVar45,(BYTE *)puVar4);
LAB_0014c6e8:
    seqStore->lit = seqStore->lit + uVar46;
    if (0xffff < uVar46) {
      if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_0014f0c9:
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46a0,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar40 = *(ulong *)((long)src + 8);
    *puVar29 = *src;
    puVar29[1] = uVar40;
    pBVar14 = seqStore->lit;
    if (0x10 < uVar46) {
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar14 + 0x10) + (-0x10 - ((long)src + 0x10)))) {
LAB_0014f0e8:
        __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x36a6,
                      "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
      }
      uVar40 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar14 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar14 + 0x18) = uVar40;
      if (0x20 < (long)uVar46) {
        lVar42 = 0;
        do {
          puVar7 = (undefined8 *)((long)src + lVar42 + 0x20);
          uVar16 = puVar7[1];
          pBVar6 = pBVar14 + lVar42 + 0x20;
          *(undefined8 *)pBVar6 = *puVar7;
          *(undefined8 *)(pBVar6 + 8) = uVar16;
          puVar7 = (undefined8 *)((long)src + lVar42 + 0x30);
          uVar16 = puVar7[1];
          *(undefined8 *)(pBVar6 + 0x10) = *puVar7;
          *(undefined8 *)(pBVar6 + 0x18) = uVar16;
          lVar42 = lVar42 + 0x20;
        } while (pBVar6 + 0x20 < pBVar14 + uVar46);
      }
      goto LAB_0014c6e8;
    }
    seqStore->lit = pBVar14 + uVar46;
  }
  psVar19 = seqStore->sequences;
  psVar19->litLength = (U16)uVar46;
  psVar19->offBase = uVar37 + 3;
  if (local_e0 < 3) {
LAB_0014f02e:
    __assert_fail("matchLength >= MINMATCH",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x46aa,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  uVar40 = local_e0 - 3;
  if (uVar40 < 0x10000) {
    uVar46 = (ulong)uVar38;
    goto LAB_0014c7ee;
  }
  ZVar10 = seqStore->longLengthType;
  uVar46 = (ulong)uVar38;
  uVar38 = uVar37;
joined_r0x0014c3ee:
  if (ZVar10 != ZSTD_llt_none) {
LAB_0014f06c:
    __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x46ad,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  seqStore->longLengthType = ZSTD_llt_matchLength;
  seqStore->longLengthPos = (U32)((ulong)((long)psVar19 - (long)seqStore->sequencesStart) >> 3);
LAB_0014c7e7:
  uVar24 = (ulong)uVar38;
LAB_0014c7ee:
  src = (void *)((long)puVar45 + local_e0);
  psVar19->mlBase = (U16)uVar40;
  psVar19 = psVar19 + 1;
  seqStore->sequences = psVar19;
  if (puVar17 < src) {
    uVar38 = (uint)uVar24;
  }
  else {
    uVar37 = UVar27 + 2;
    lVar42 = *(long *)(pBVar11 + uVar37);
    pUVar12[(ulong)(lVar42 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] = uVar37;
    pUVar12[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] =
         ((int)src + -2) - iVar44;
    pUVar13[(ulong)(lVar42 * -0x30e44323405a9d00) >> (bVar21 & 0x3f)] = uVar37;
    pUVar13[(ulong)(*(long *)((long)src + -1) * -0x30e44323405a9d00) >> (bVar21 & 0x3f)] =
         ((int)src + -1) - iVar44;
    uVar40 = uVar46;
    do {
      uVar37 = (uint)uVar40;
      uVar33 = uVar24 & 0xffffffff;
      uVar46 = uVar40;
      uVar38 = (uint)uVar24;
      if ((uVar37 == 0) || ((int)*src != *(int *)((long)src - uVar40))) break;
      lVar42 = -uVar40;
      puVar45 = (ulong *)((long)src + 4);
      puVar25 = (ulong *)((long)src + lVar42 + 4);
      puVar29 = puVar45;
      if (puVar45 < puVar1) {
        if (*puVar25 == *puVar45) {
          lVar36 = 0;
          do {
            puVar29 = (ulong *)((long)src + lVar36 + 0xc);
            if (puVar1 <= puVar29) {
              puVar25 = (ulong *)((long)src + lVar42 + lVar36 + 0xc);
              puVar29 = (ulong *)((long)src + lVar36 + 0xc);
              goto LAB_0014c947;
            }
            uVar46 = *(ulong *)((long)src + lVar36 + lVar42 + 0xc);
            uVar43 = *puVar29;
            lVar36 = lVar36 + 8;
          } while (uVar46 == uVar43);
          uVar43 = uVar43 ^ uVar46;
          uVar46 = 0;
          if (uVar43 != 0) {
            for (; (uVar43 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
            }
          }
          uVar46 = (uVar46 >> 3 & 0x1fffffff) + lVar36;
        }
        else {
          uVar43 = *puVar45 ^ *puVar25;
          uVar46 = 0;
          if (uVar43 != 0) {
            for (; (uVar43 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
            }
          }
          uVar46 = uVar46 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_0014c947:
        if ((puVar29 < puVar2) && ((int)*puVar25 == (int)*puVar29)) {
          puVar29 = (ulong *)((long)puVar29 + 4);
          puVar25 = (ulong *)((long)puVar25 + 4);
        }
        if ((puVar29 < puVar3) && ((short)*puVar25 == (short)*puVar29)) {
          puVar29 = (ulong *)((long)puVar29 + 2);
          puVar25 = (ulong *)((long)puVar25 + 2);
        }
        if (puVar29 < puVar5) {
          puVar29 = (ulong *)((long)puVar29 + (ulong)((char)*puVar25 == (char)*puVar29));
        }
        uVar46 = (long)puVar29 - (long)puVar45;
      }
      UVar27 = (int)src - iVar44;
      uVar43 = *src;
      pUVar13[uVar43 * -0x30e44323405a9d00 >> (bVar21 & 0x3f)] = UVar27;
      pUVar12[uVar43 * -0x30e44323485a9b9d >> (bVar20 & 0x3f)] = UVar27;
      if (seqStore->maxNbSeq <= (ulong)((long)psVar19 - (long)seqStore->sequencesStart >> 3))
      goto LAB_0014eff0;
      if (0x20000 < seqStore->maxNbLit) goto LAB_0014f00f;
      puVar45 = (ulong *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < puVar45) goto LAB_0014f04d;
      if (puVar5 < src) goto LAB_0014efd1;
      if (puVar4 < src) {
        ZSTD_safecopyLiterals((BYTE *)puVar45,(BYTE *)src,(BYTE *)src,(BYTE *)puVar4);
      }
      else {
        uVar43 = *(ulong *)((long)src + 8);
        *puVar45 = *src;
        puVar45[1] = uVar43;
      }
      psVar19 = seqStore->sequences;
      psVar19->litLength = 0;
      psVar19->offBase = 1;
      if (uVar46 + 4 < 3) goto LAB_0014f02e;
      if (0xffff < uVar46 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0014f06c;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar19 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar19->mlBase = (U16)(uVar46 + 1);
      psVar19 = psVar19 + 1;
      seqStore->sequences = psVar19;
      src = (void *)((long)src + uVar46 + 4);
      uVar46 = uVar33;
      uVar24 = uVar40;
      uVar40 = uVar33;
      uVar38 = uVar37;
    } while (src <= puVar17);
  }
  puVar29 = (ulong *)((long)src + 1);
  uVar37 = (uint)uVar46;
  puVar45 = (ulong *)src;
  if (puVar17 < puVar29) goto LAB_0014ef6e;
  goto LAB_0014bf28;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_noDict_4(ms, seqStore, rep, src, srcSize);
    case 5 :
        return ZSTD_compressBlock_doubleFast_noDict_5(ms, seqStore, rep, src, srcSize);
    case 6 :
        return ZSTD_compressBlock_doubleFast_noDict_6(ms, seqStore, rep, src, srcSize);
    case 7 :
        return ZSTD_compressBlock_doubleFast_noDict_7(ms, seqStore, rep, src, srcSize);
    }
}